

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::Matrix::makeRotation(Matrix *dst,V3d *axis,float32 angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar4 = (float)axis->z * (float)axis->z +
          (float)axis->x * (float)axis->x + (float)axis->y * (float)axis->y;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = 1.0 / fVar4;
  }
  fVar1 = (float)axis->x * fVar4;
  fVar2 = (float)axis->y * fVar4;
  fVar4 = fVar4 * (float)axis->z;
  fVar6 = ((float)angle * 3.1415927) / 180.0;
  fVar3 = sinf(fVar6);
  fVar6 = cosf(fVar6);
  fVar5 = 1.0 - fVar6;
  (dst->right).x = (float32)(fVar1 * fVar1 * fVar5 + fVar6);
  fVar7 = fVar1 * fVar2 * fVar5;
  (dst->right).y = (float32)(fVar7 + fVar4 * fVar3);
  fVar8 = fVar1 * fVar4 * fVar5;
  (dst->right).z = (float32)(fVar8 - fVar2 * fVar3);
  (dst->up).x = (float32)(fVar7 - fVar4 * fVar3);
  (dst->up).y = (float32)(fVar2 * fVar2 * fVar5 + fVar6);
  fVar7 = fVar2 * fVar4 * fVar5;
  (dst->up).z = (float32)(fVar7 + fVar1 * fVar3);
  (dst->at).x = (float32)(fVar8 + fVar2 * fVar3);
  (dst->at).y = (float32)(fVar7 - fVar1 * fVar3);
  (dst->at).z = (float32)(fVar4 * fVar4 * fVar5 + fVar6);
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  dst->flags = 3;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const V3d *axis, float32 angle)
{
//	V3d v = normalize(*axis);
	float32 len = dot(*axis, *axis);
	if(len != 0.0f) len = 1.0f/sqrtf(len);
	V3d v = rw::scale(*axis, len);
	angle = angle*(float)M_PI/180.0f;
	float32 s = sinf(angle);
	float32 c = cosf(angle);
	float32 t = 1.0f - c;

	dst->right.x = c + v.x*v.x*t;
	dst->right.y = v.x*v.y*t + v.z*s;
	dst->right.z = v.z*v.x*t - v.y*s;
	dst->up.x = v.x*v.y*t - v.z*s;
	dst->up.y = c + v.y*v.y*t;
	dst->up.z = v.y*v.z*t + v.x*s;
	dst->at.x = v.z*v.x*t + v.y*s;
	dst->at.y = v.y*v.z*t - v.x*s;
	dst->at.z = c + v.z*v.z*t;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
}